

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

char * getoffset(char *strp,int_fast32_t *offsetp)

{
  bool bVar1;
  _Bool neg;
  int_fast32_t *offsetp_local;
  char *strp_local;
  
  bVar1 = false;
  if (*strp == '-') {
    bVar1 = true;
    offsetp_local = (int_fast32_t *)(strp + 1);
  }
  else {
    offsetp_local = (int_fast32_t *)strp;
    if (*strp == '+') {
      offsetp_local = (int_fast32_t *)(strp + 1);
    }
  }
  strp_local = getsecs((char *)offsetp_local,offsetp);
  if (strp_local == (char *)0x0) {
    strp_local = (char *)0x0;
  }
  else if (bVar1) {
    *offsetp = -*offsetp;
  }
  return strp_local;
}

Assistant:

static const char * getoffset( const char * strp, int_fast32_t * offsetp )
{
    bool neg = false;

    if ( *strp == '-' )
    {
        neg = true;
        ++strp;
    }
    else if ( *strp == '+' )
    {
        ++strp;
    }

    strp = getsecs( strp, offsetp );

    if ( strp == NULL )
    {
        return NULL;        /* illegal time */
    }

    if ( neg )
    {
        *offsetp = - *offsetp;
    }

    return strp;
}